

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_capacity_valid_fn(int _i)

{
  char *pcVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 0x2a;
  sVar2 = private_ACUtils_ADynArray_capacity(&local_38);
  if (sVar2 == 0x2a) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x9c);
    local_18 = 0xd;
    sVar2 = private_ACUtils_ADynArray_capacity(&local_38);
    if (sVar2 == 0xd) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x9e);
      local_18 = 0;
      sVar2 = private_ACUtils_ADynArray_capacity(&local_38);
      if (sVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xa0);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xa0,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtils_ADynArray_capacity(&array) == 0",
                        "private_ACUtils_ADynArray_capacity(&array)",sVar2,"0",0,0);
    }
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 13";
    pcVar3 = "private_ACUtils_ADynArray_capacity(&array) == 13";
    line = 0x9e;
    uVar4 = 0xd;
  }
  else {
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 42";
    pcVar3 = "private_ACUtils_ADynArray_capacity(&array) == 42";
    line = 0x9c;
    uVar4 = 0x2a;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,
                    "private_ACUtils_ADynArray_capacity(&array)",sVar2,pcVar1 + 0x33,uVar4,0);
}

Assistant:

START_TEST(test_ADynArray_capacity_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {nullptr, nullptr};
    array.size = 0;
    array.buffer = nullptr;
    array.growStrategy = nullptr;
    array.capacity = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 42);
    array.capacity = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 13);
    array.capacity = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 0);
}